

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> __thiscall
SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>::operator++
          (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> *this,int param_2)

{
  long lVar1;
  code *pcVar2;
  long lVar3;
  long *in_RDI;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> tmp;
  SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter> local_8;
  
  lVar1 = *in_RDI;
  lVar3 = std::numeric_limits<long>::max();
  if (lVar1 == lVar3) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  SafeInt(&local_8,in_RDI);
  if (SCARRY8(*in_RDI,1)) {
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *in_RDI = *in_RDI + 1;
  return (SafeInt<long,_safeint_exception_handlers::SafeInt_InvalidParameter>)local_8.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator ++( int )  SAFEINT_CPP_THROW // dummy arg to comply with spec
    {
        if( m_int != std::numeric_limits<T>::max() )
        {
            SafeInt< T, E > tmp( m_int );

            m_int++;
            return tmp;
        }
        E::SafeIntOnOverflow();
    }